

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelloWorld.cpp
# Opt level: O3

path * findDocRoot(path *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  path *ppVar5;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  path *ppVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  path *__rhs;
  path *ppVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar10;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  path cp;
  path local_b0;
  undefined1 local_88 [40];
  path local_60;
  string *local_38;
  
  std::filesystem::current_path_abi_cxx11_();
  local_b0._M_pathname._M_dataplus._M_p = (pointer)&local_b0._M_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,local_88._0_8_,(pointer)(local_88._0_8_ + local_88._8_8_));
  ppVar7 = &local_b0;
  fmt._M_str = (char *)filename;
  fmt._M_len = (size_t)"Looking for {} in {}";
  webfront::log::info<std::__cxx11::string&,std::__cxx11::string>
            ((log *)0x14,fmt,&ppVar7->_M_pathname,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
    operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                    local_b0._M_pathname.field_2._M_allocated_capacity + 1);
  }
  webfront::http::std::filesystem::__cxx11::path::~path((path *)local_88);
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_60,filename,auto_format);
  webfront::http::std::filesystem::__cxx11::operator/((path *)local_88,&local_b0,&local_60);
  cVar3 = std::filesystem::status((path *)local_88);
  webfront::http::std::filesystem::__cxx11::path::~path((path *)local_88);
  webfront::http::std::filesystem::__cxx11::path::~path(&local_60);
  webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
  if ((cVar3 == '\0') || (cVar3 == -1)) {
    std::filesystem::temp_directory_path_abi_cxx11_();
    local_b0._M_pathname._M_dataplus._M_p = (pointer)&local_b0._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,local_88._0_8_,(pointer)(local_88._0_8_ + local_88._8_8_));
    fmt_00._M_str = (char *)&local_b0;
    fmt_00._M_len = (size_t)"  not found : Looking now in temp directory {} ";
    webfront::log::info<std::__cxx11::string>((log *)0x2f,fmt_00,&ppVar7->_M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
      operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                      local_b0._M_pathname.field_2._M_allocated_capacity + 1);
    }
    webfront::http::std::filesystem::__cxx11::path::~path((path *)local_88);
    std::filesystem::temp_directory_path_abi_cxx11_();
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_60,filename,auto_format);
    webfront::http::std::filesystem::__cxx11::operator/((path *)local_88,&local_b0,&local_60);
    cVar3 = std::filesystem::status((path *)local_88);
    webfront::http::std::filesystem::__cxx11::path::~path((path *)local_88);
    webfront::http::std::filesystem::__cxx11::path::~path(&local_60);
    webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
    if ((cVar3 == '\0') || (cVar3 == -1)) {
      webfront::http::std::filesystem::__cxx11::path::path(__return_storage_ptr__);
      std::filesystem::current_path_abi_cxx11_();
      bVar10 = (local_88._32_8_ & 3) == 0;
      local_38 = filename;
      if (bVar10) {
        ppVar5 = (path *)std::filesystem::__cxx11::path::_List::begin();
      }
      else {
        ppVar5 = (path *)0x0;
      }
      bVar10 = !bVar10 && local_88._8_8_ == 0;
      do {
        ppVar9 = ppVar5;
        if ((local_88._32_8_ & 3) == 0) {
          ppVar5 = (path *)std::filesystem::__cxx11::path::_List::end();
          ppVar7 = (path *)local_88._32_8_;
          if ((local_88._32_8_ & 3) == 0) {
            __rhs = ppVar9;
            if (ppVar9 == ppVar5) goto LAB_001073bd;
          }
          else {
            __rhs = (path *)local_88;
            if (!bVar10) {
LAB_001073bd:
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_60._M_pathname,"Cannot find ",local_38);
              pbVar6 = webfront::http::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_60._M_pathname," file");
              local_b0._M_pathname._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
              paVar8 = &pbVar6->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_pathname._M_dataplus._M_p == paVar8) {
                local_b0._M_pathname.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_b0._M_pathname.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                local_b0._M_pathname._M_dataplus._M_p = (pointer)&local_b0._M_pathname.field_2;
              }
              else {
                local_b0._M_pathname.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              }
              local_b0._M_pathname._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              std::runtime_error::runtime_error(this,(string *)&local_b0);
              __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        else {
          if (bVar10) goto LAB_001073bd;
          __rhs = (path *)local_88;
        }
        webfront::http::std::filesystem::__cxx11::operator/(&local_b0,__return_storage_ptr__,__rhs);
        if (&local_b0 != __return_storage_ptr__) {
          ppVar7 = (path *)&__return_storage_ptr__->_M_cmpts;
          findDocRoot();
        }
        webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
        uVar2 = local_88._32_8_;
        std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                  (&local_b0,(char (*) [9])"WebFront",auto_format);
        ppVar5 = (path *)local_88;
        if ((uVar2 & 3) == 0) {
          ppVar5 = ppVar9;
        }
        iVar4 = std::filesystem::__cxx11::path::compare(ppVar5);
        webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
        if (iVar4 == 0) {
          std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
                    (&local_60,(char (*) [4])"src",auto_format);
          webfront::http::std::filesystem::__cxx11::operator/
                    (&local_b0,__return_storage_ptr__,&local_60);
          if (&local_b0 != __return_storage_ptr__) {
            ppVar7 = (path *)&__return_storage_ptr__->_M_cmpts;
            findDocRoot();
          }
          webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
          webfront::http::std::filesystem::__cxx11::path::~path(&local_60);
          pcVar1 = (__return_storage_ptr__->_M_pathname)._M_dataplus._M_p;
          local_b0._M_pathname._M_dataplus._M_p = (pointer)&local_b0._M_pathname.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,pcVar1,
                     pcVar1 + (__return_storage_ptr__->_M_pathname)._M_string_length);
          fmt_01._M_str = (char *)&local_b0;
          fmt_01._M_len = (size_t)"  not found : Looking now in source directory {}";
          webfront::log::info<std::__cxx11::string>((log *)0x30,fmt_01,&ppVar7->_M_pathname);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
            operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                            local_b0._M_pathname.field_2._M_allocated_capacity + 1);
          }
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (&local_60,local_38,auto_format);
          webfront::http::std::filesystem::__cxx11::operator/
                    (&local_b0,__return_storage_ptr__,&local_60);
          cVar3 = std::filesystem::status(&local_b0);
          webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
          webfront::http::std::filesystem::__cxx11::path::~path(&local_60);
          if ((cVar3 != '\0') && (cVar3 != -1)) {
            webfront::http::std::filesystem::__cxx11::path::~path((path *)local_88);
            return __return_storage_ptr__;
          }
        }
        ppVar7 = (path *)&ppVar9[1]._M_pathname._M_string_length;
        ppVar5 = ppVar7;
        if ((local_88._32_8_ & 3) != 0) {
          bVar10 = true;
          ppVar5 = ppVar9;
        }
      } while( true );
    }
    std::filesystem::temp_directory_path_abi_cxx11_();
  }
  else {
    std::filesystem::current_path_abi_cxx11_();
  }
  return __return_storage_ptr__;
}

Assistant:

filesystem::path findDocRoot(string filename) {
    using namespace filesystem;

    log::info("Looking for {} in {}", filename, current_path().string());
    if (exists(current_path() / filename)) return current_path();

    log::info("  not found : Looking now in temp directory {} ", temp_directory_path().string());
    if (exists(temp_directory_path() / filename)) return temp_directory_path();

    path webfront, cp{current_path()};
    for (auto element = cp.begin(); element != cp.end(); ++element) {
        webfront = webfront / *element;
        if (*element == "WebFront") {
            webfront = webfront / "src";
            log::info("  not found : Looking now in source directory {}", webfront.string());
            if (exists(webfront / filename)) return webfront;
        }
    }

    throw runtime_error("Cannot find " + filename + " file");
}